

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_CipherRules_Test::TestBody(SSLTest_CipherRules_Test *this)

{
  StackIteratorImpl<stack_st_SSL_CIPHER> other;
  StackIteratorImpl<stack_st_SSL_CIPHER> other_00;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  SSL_METHOD *pSVar4;
  pointer psVar5;
  char *pcVar6;
  Message *pMVar7;
  char *pcVar8;
  stack_st_SSL_CIPHER *psVar9;
  SSL_CTX *ctx_00;
  SSL_CTX *ctx_01;
  char *in_R9;
  StackIterator<stack_st_SSL_CIPHER> SVar10;
  string local_5b0;
  AssertHelper local_590;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__13;
  SSL_CIPHER *cipher_1;
  StackIterator<stack_st_SSL_CIPHER> __end3_1;
  StackIterator<stack_st_SSL_CIPHER> __begin3_1;
  stack_st_SSL_CIPHER **__range3_1;
  undefined1 local_520 [7];
  bool found;
  AssertHelper local_500;
  Message local_4f8;
  int local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__11;
  UniquePtr<SSL_CTX> ctx_3;
  char *rule_2;
  char **__end2_3;
  char **__begin2_3;
  char *(*__range2_3) [2];
  AssertHelper local_450;
  Message local_448;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__10;
  Message local_420;
  int local_418 [2];
  undefined1 local_410 [8];
  AssertionResult gtest_ar;
  SSL_CIPHER *cipher;
  StackIterator<stack_st_SSL_CIPHER> __end3;
  StackIterator<stack_st_SSL_CIPHER> __begin3;
  stack_st_SSL_CIPHER **__range3;
  AssertHelper local_390;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_348;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<SSL_CTX> ctx_2;
  ScopedTrace gtest_trace_605;
  char *rule_1;
  char **__end2_2;
  char **__begin2_2;
  char *(*__range2_2) [10];
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<SSL_CTX> ctx_1;
  ScopedTrace gtest_trace_596;
  char *rule;
  char **__end2_1;
  char **__begin2_1;
  char *(*__range2_1) [15];
  AssertHelper local_220;
  string local_218;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_128;
  string local_120;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_40;
  UniquePtr<SSL_CTX> ctx;
  ScopedTrace gtest_trace_574;
  CipherTest *t;
  CipherTest *__end2;
  CipherTest *__begin2;
  CipherTest (*__range2) [25];
  SSLTest_CipherRules_Test *this_local;
  
  __end2 = (CipherTest *)&(anonymous_namespace)::kCipherTests;
  do {
    if (__end2 == (CipherTest *)&DAT_0065d108) {
      for (__end2_1 = &(anonymous_namespace)::kBadRules; __end2_1 != (char **)&DAT_0065c988;
          __end2_1 = __end2_1 + 1) {
        pcVar6 = *__end2_1;
        testing::ScopedTrace::ScopedTrace
                  ((ScopedTrace *)
                   ((long)&ctx_1._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x254,pcVar6);
        pSVar4 = (SSL_METHOD *)TLS_method();
        psVar5 = (pointer)SSL_CTX_new(pSVar4);
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__6.message_,psVar5);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_280,
                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__7.message_,(internal *)local_280,
                     (AssertionResult *)0x4d86cd,"false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x256,pcVar8);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
          testing::Message::~Message(&local_288);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar__6.message_);
          iVar3 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar5,pcVar6);
          local_2c1 = iVar3 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&__range2_2,(internal *)local_2c0,
                       (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), rule)","true","false",
                       in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,600,pcVar6);
            testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            std::__cxx11::string::~string((string *)&__range2_2);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
          ERR_clear_error();
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&ctx_1._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7));
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) {
          return;
        }
      }
      for (__end2_2 = (char **)&(anonymous_namespace)::kMustNotIncludeDeprecated;
          __end2_2 != (char **)&(anonymous_namespace)::kShouldIncludeCBCSHA256;
          __end2_2 = __end2_2 + 1) {
        pcVar6 = *__end2_2;
        testing::ScopedTrace::ScopedTrace
                  ((ScopedTrace *)
                   ((long)&ctx_2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x25d,pcVar6);
        pSVar4 = (SSL_METHOD *)TLS_method();
        psVar5 = (pointer)SSL_CTX_new(pSVar4);
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__8.message_,psVar5);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_338,
                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
        if (!bVar1) {
          testing::Message::Message(&local_340);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__9.message_,(internal *)local_338,
                     (AssertionResult *)0x4d86cd,"false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_348,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x25f,pcVar8);
          testing::internal::AssertHelper::operator=(&local_348,&local_340);
          testing::internal::AssertHelper::~AssertHelper(&local_348);
          std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
          testing::Message::~Message(&local_340);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar__8.message_);
          local_37c = SSL_CTX_set_strict_cipher_list(psVar5,pcVar6);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_378,&local_37c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
          if (!bVar1) {
            testing::Message::Message(&local_388);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&__range3,(internal *)local_378,
                       (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false",
                       "true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x261,pcVar6);
            testing::internal::AssertHelper::operator=(&local_390,&local_388);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            std::__cxx11::string::~string((string *)&__range3);
            testing::Message::~Message(&local_388);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__8.message_);
            psVar9 = SSL_CTX_get_ciphers(psVar5);
            SVar10 = begin<stack_st_SSL_CIPHER>(psVar9);
            __end3.idx_ = (size_t)SVar10.sk_;
            SVar10 = end<stack_st_SSL_CIPHER>(psVar9);
            __end3.sk_ = (stack_st_SSL_CIPHER *)SVar10.idx_;
            while (other_00.idx_ = (size_t)__end3.sk_, other_00.sk_ = SVar10.sk_,
                  bVar1 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator!=
                                    ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3.idx_,other_00
                                    ), bVar1) {
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                               ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3.idx_);
              local_418[1] = 0;
              local_418[0] = SSL_CIPHER_get_cipher_nid
                                       ((SSL_CIPHER *)
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
              testing::internal::CmpHelperNE<int,int>
                        ((internal *)local_410,"0","SSL_CIPHER_get_cipher_nid(cipher)",local_418 + 1
                         ,local_418);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
              if (!bVar1) {
                testing::Message::Message(&local_420);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x263,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__10.message_,&local_420);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_420);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
              bVar1 = ssl_cipher_is_deprecated
                                ((SSL_CIPHER *)
                                 gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
              local_439 = (bool)(~bVar1 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_438,&local_439,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
              if (!bVar1) {
                testing::Message::Message(&local_448);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&__range2_3,(internal *)local_438,
                           (AssertionResult *)"ssl_cipher_is_deprecated(cipher)","true","false",
                           in_R9);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_450,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x264,pcVar6);
                testing::internal::AssertHelper::operator=(&local_450,&local_448);
                testing::internal::AssertHelper::~AssertHelper(&local_450);
                std::__cxx11::string::~string((string *)&__range2_3);
                testing::Message::~Message(&local_448);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
              internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator++
                        ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3.idx_);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&ctx_2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7));
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) {
          return;
        }
      }
      __end2_3 = (char **)&(anonymous_namespace)::kShouldIncludeCBCSHA256;
      do {
        if (__end2_3 == (char **)&(anonymous_namespace)::kBadCurvesLists) {
          return;
        }
        pcVar6 = *__end2_3;
        pSVar4 = (SSL_METHOD *)TLS_method();
        psVar5 = (pointer)SSL_CTX_new(pSVar4);
        std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar__11.message_,psVar5);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_4a8,
                   (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__11.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
        if (!bVar1) {
          testing::Message::Message(&local_4b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__12.message_,(internal *)local_4a8,
                     (AssertionResult *)0x4d86cd,"false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_4b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x26b,pcVar8);
          testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4b8);
          std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
          testing::Message::~Message(&local_4b0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar__11.message_);
          local_4ec = SSL_CTX_set_strict_cipher_list(psVar5,pcVar6);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_4e8,&local_4ec,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
          if (!bVar1) {
            testing::Message::Message(&local_4f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_520,(internal *)local_4e8,
                       (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false",
                       "true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_500,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x26c,pcVar6);
            testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
            testing::internal::AssertHelper::~AssertHelper(&local_500);
            std::__cxx11::string::~string((string *)local_520);
            testing::Message::~Message(&local_4f8);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            __range3_1._7_1_ = 0;
            psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__11.message_);
            psVar9 = SSL_CTX_get_ciphers(psVar5);
            SVar10 = begin<stack_st_SSL_CIPHER>(psVar9);
            __end3_1.idx_ = (size_t)SVar10.sk_;
            SVar10 = end<stack_st_SSL_CIPHER>(psVar9);
            __end3_1.sk_ = (stack_st_SSL_CIPHER *)SVar10.idx_;
            while (other.idx_ = (size_t)__end3_1.sk_, other.sk_ = SVar10.sk_,
                  bVar1 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator!=
                                    ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3_1.idx_,other)
                  , bVar1) {
              gtest_ar__13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                               ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3_1.idx_);
              uVar2 = SSL_CIPHER_get_protocol_id
                                ((SSL_CIPHER *)
                                 gtest_ar__13.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
              if (uVar2 == 0xc027) {
                __range3_1._7_1_ = 1;
                break;
              }
              internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator++
                        ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&__end3_1.idx_);
            }
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_580,(bool *)((long)&__range3_1 + 7),(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
            if (!bVar1) {
              testing::Message::Message(&local_588);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_5b0,(internal *)local_580,(AssertionResult *)"found","false","true",
                         in_R9);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_590,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x276,pcVar6);
              testing::internal::AssertHelper::operator=(&local_590,&local_588);
              testing::internal::AssertHelper::~AssertHelper(&local_590);
              std::__cxx11::string::~string((string *)&local_5b0);
              testing::Message::~Message(&local_588);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
        std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__11.message_);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) {
          return;
        }
        __end2_3 = __end2_3 + 1;
      } while( true );
    }
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)
               ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23e,__end2->rule);
    pSVar4 = (SSL_METHOD *)TLS_method();
    psVar5 = (pointer)SSL_CTX_new(pSVar4);
    std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&local_40,psVar5);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_60,&local_40,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_60,(AssertionResult *)0x4d86cd,"false","true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x240,pcVar6);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      testing::Message::~Message(&local_68);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
      local_ac = SSL_CTX_set_cipher_list((SSL_CTX *)psVar5,__end2->rule);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                   (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), t.rule)","false","true",
                   in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x243,pcVar6);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_b8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
        local_f1 = CipherListsEqual(psVar5,&__end2->expected);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar1) {
          testing::Message::Message(&local_100);
          pMVar7 = testing::Message::operator<<
                             (&local_100,(char (*) [27])"Cipher rule evaluated to:\n");
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
          (anonymous_namespace)::CipherListToString_abi_cxx11_
                    (&local_120,(_anonymous_namespace_ *)psVar5,ctx_00);
          pMVar7 = testing::Message::operator<<(pMVar7,&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_f0,
                     (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",
                     in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x244,pcVar6);
          testing::internal::AssertHelper::operator=(&local_128,pMVar7);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          std::__cxx11::string::~string((string *)&local_120);
          testing::Message::~Message(&local_100);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if ((__end2->strict_fail & 1U) == 0) {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
          local_1a4 = SSL_CTX_set_strict_cipher_list(psVar5,__end2->rule);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
          if (!bVar1) {
            testing::Message::Message(&local_1b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_1a0,
                       (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)",
                       "false","true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x24c,pcVar6);
            testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
            testing::internal::AssertHelper::~AssertHelper(&local_1b8);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_1b0);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ != 0) goto LAB_001767f8;
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
          local_1e9 = CipherListsEqual(psVar5,&__end2->expected);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar1) {
            testing::Message::Message(&local_1f8);
            pMVar7 = testing::Message::operator<<
                               (&local_1f8,(char (*) [27])"Cipher rule evaluated to:\n");
            psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
            (anonymous_namespace)::CipherListToString_abi_cxx11_
                      (&local_218,(_anonymous_namespace_ *)psVar5,ctx_01);
            pMVar7 = testing::Message::operator<<(pMVar7,&local_218);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&__range2_1,(internal *)local_1e8,
                       (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",
                       in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_220,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x24d,pcVar6);
            testing::internal::AssertHelper::operator=(&local_220,pMVar7);
            testing::internal::AssertHelper::~AssertHelper(&local_220);
            std::__cxx11::string::~string((string *)&__range2_1);
            std::__cxx11::string::~string((string *)&local_218);
            testing::Message::~Message(&local_1f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
        }
        else {
          psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_40);
          iVar3 = SSL_CTX_set_strict_cipher_list(psVar5,__end2->rule);
          local_159 = iVar3 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_158,&local_159,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_158,
                       (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)","true"
                       ,"false",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x24a,pcVar6);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
LAB_001767f8:
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 7));
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

TEST(SSLTest, CipherRules) {
  for (const CipherTest &t : kCipherTests) {
    SCOPED_TRACE(t.rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    // Test lax mode.
    ASSERT_TRUE(SSL_CTX_set_cipher_list(ctx.get(), t.rule));
    EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
        << "Cipher rule evaluated to:\n"
        << CipherListToString(ctx.get());

    // Test strict mode.
    if (t.strict_fail) {
      EXPECT_FALSE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
    } else {
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
      EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
          << "Cipher rule evaluated to:\n"
          << CipherListToString(ctx.get());
    }
  }

  for (const char *rule : kBadRules) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    EXPECT_FALSE(SSL_CTX_set_cipher_list(ctx.get(), rule));
    ERR_clear_error();
  }

  for (const char *rule : kMustNotIncludeDeprecated) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));
    for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
      EXPECT_NE(NID_undef, SSL_CIPHER_get_cipher_nid(cipher));
      EXPECT_FALSE(ssl_cipher_is_deprecated(cipher));
    }
  }

  {
    for (const char *rule : kShouldIncludeCBCSHA256) {
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));

      bool found = false;
      for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
        if ((TLS1_CK_ECDHE_RSA_WITH_AES_128_CBC_SHA256 & 0xffff) ==
            SSL_CIPHER_get_protocol_id(cipher)) {
          found = true;
          break;
        }
      }
      EXPECT_TRUE(found);
    }
  }
}